

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::rc::Texture3D::updateView(Texture3D *this,DepthStencilMode mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ConstPixelBufferAccess *levels;
  int numLevels;
  int iVar5;
  uint uVar6;
  Texture3DView local_28;
  
  uVar3 = (this->super_Texture).m_baseLevel;
  uVar4 = (ulong)uVar3;
  if ((uVar4 < 0xe) && ((this->m_levels).m_data[uVar4].m_cap != 0)) {
    uVar1 = (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[0];
    uVar2 = (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[1];
    if ((uVar2 != 0 && uVar1 != 0) &&
       ((this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[2] != 0)) {
      numLevels = 1;
      if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
        uVar6 = (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[2];
        iVar5 = ((this->super_Texture).m_maxLevel - uVar3) + 1;
        if ((int)uVar6 < (int)uVar2) {
          uVar6 = uVar2;
        }
        if ((int)uVar6 < (int)uVar1) {
          uVar6 = uVar1;
        }
        uVar3 = 0x20;
        if (uVar6 != 0) {
          uVar3 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar3 = uVar3 ^ 0x1f;
        }
        numLevels = 0x20 - uVar3;
        if (iVar5 < (int)(0x20 - uVar3)) {
          numLevels = iVar5;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      levels = (this->m_levels).m_effectiveAccess + uVar4;
      goto LAB_018dc864;
    }
  }
  numLevels = 0;
  levels = (ConstPixelBufferAccess *)0x0;
LAB_018dc864:
  tcu::Texture3DView::Texture3DView(&local_28,numLevels,levels);
  (this->m_view).m_numLevels = local_28.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_28._4_4_;
  (this->m_view).m_levels = local_28.m_levels;
  return;
}

Assistant:

void Texture3D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const int	depth		= getLevel(baseLevel).getDepth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels3D(width, height, depth)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture3DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture3DView(0, DE_NULL);
}